

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Base64.cc
# Opt level: O0

ssize_t __thiscall Pl_Base64::write(Pl_Base64 *this,int __fd,void *__buf,size_t __n)

{
  logic_error *this_00;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  size_t len_local;
  uchar *data_local;
  Pl_Base64 *this_local;
  
  if ((this->finished & 1U) != 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Pl_Base64 used after finished");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (this->action == a_decode) {
    decode(this,(uchar *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
    sVar1 = extraout_RAX;
  }
  else {
    encode(this,(uchar *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
    sVar1 = extraout_RAX_00;
  }
  return sVar1;
}

Assistant:

void
Pl_Base64::write(unsigned char const* data, size_t len)
{
    if (finished) {
        throw std::logic_error("Pl_Base64 used after finished");
    }
    if (this->action == a_decode) {
        decode(data, len);
    } else {
        encode(data, len);
    }
}